

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

deUint32 __thiscall deqp::gls::ub::UniformBufferManager::allocBuffer(UniformBufferManager *this)

{
  int iVar1;
  deUint32 err;
  size_type sVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  value_type_conflict2 local_14;
  UniformBufferManager *pUStack_10;
  deUint32 buf;
  UniformBufferManager *this_local;
  
  local_14 = 0;
  pUStack_10 = this;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->m_buffers,sVar2 + 1);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6c8))(1,&local_14);
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(err,"Failed to allocate uniform buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                  ,0x558);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_buffers,&local_14);
  return local_14;
}

Assistant:

deUint32 UniformBufferManager::allocBuffer (void)
{
	deUint32 buf = 0;

	m_buffers.reserve(m_buffers.size()+1);
	m_renderCtx.getFunctions().genBuffers(1, &buf);
	GLU_EXPECT_NO_ERROR(m_renderCtx.getFunctions().getError(), "Failed to allocate uniform buffer");
	m_buffers.push_back(buf);

	return buf;
}